

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::
SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::FinalizeAllObjects
          (SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this)

{
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  ClearAllocators((HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                   *)this);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::FinalizeHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            (this->pendingDisposeList,0);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::FinalizeHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            ((this->
             super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ).partialHeapBlockList,0);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::FinalizeHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            ((this->
             super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ).
             super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             .heapBlockList,0);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::FinalizeHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            ((this->
             super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ).
             super_HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             .fullBlockList,0);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::SmallFinalizableHeapBucketBaseT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>::FinalizeHeapBlockList(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
            ((this->
             super_SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ).partialSweptHeapBlockList,0);
  return;
}

Assistant:

void
SmallFinalizableHeapBucketBaseT<TBlockType>::FinalizeAllObjects()
{
    // Finalize all objects on shutdown.

    // Clear allocators to update the information on the heapblock
    // Walk through the allocated object and call finalize and dispose on them
    this->ClearAllocators();
    FinalizeHeapBlockList(this->pendingDisposeList);
#if ENABLE_PARTIAL_GC
    FinalizeHeapBlockList(this->partialHeapBlockList);
#endif
    FinalizeHeapBlockList(this->heapBlockList);
    FinalizeHeapBlockList(this->fullBlockList);

#if ENABLE_PARTIAL_GC && ENABLE_CONCURRENT_GC
    FinalizeHeapBlockList(this->partialSweptHeapBlockList);
#endif
}